

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_utils.h
# Opt level: O2

void __thiscall auto_array<short>::push_silence(auto_array<short> *this,size_t length)

{
  size_t sVar1;
  
  sVar1 = this->length_;
  if (this->capacity_ < length + sVar1) {
    reserve(this,length + sVar1);
    sVar1 = this->length_;
  }
  if (this->data_ != (short *)0x0) {
    memset(this->data_ + sVar1,0,length * 2);
    sVar1 = this->length_;
  }
  this->length_ = sVar1 + length;
  return;
}

Assistant:

void push_silence(size_t length)
  {
    if (length_ + length > capacity_) {
      reserve(length + length_);
    }
    if (data_) {
      PodZero(data_ + length_, length);
    }
    length_ += length;
  }